

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synth_core.cpp
# Opt level: O3

void __thiscall V2ModDel::renderAux2Main(V2ModDel *this,StereoSample *dest,int nsamples)

{
  float fVar1;
  uint32_t uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint32_t uVar6;
  float *pfVar7;
  float *pfVar8;
  ulong uVar9;
  ulong uVar10;
  int iVar11;
  float fVar12;
  float fVar13;
  StereoSample SVar14;
  float fVar15;
  
  if (0 < nsamples && this->wetout != 0.0) {
    uVar9 = 0;
    do {
      fVar12 = this->inst->aux2buf[uVar9] + 3.8146973e-06;
      uVar2 = this->mcnt;
      uVar3 = this->mmaxoffs;
      uVar10 = (ulong)((int)uVar2 >> 0x1f ^ uVar2 * 2) * (ulong)uVar3;
      uVar4 = this->dbptr;
      iVar11 = (int)(uVar10 >> 0x20) + this->dboffs[0];
      uVar5 = this->dbufmask;
      pfVar7 = this->db[0];
      pfVar8 = this->db[1];
      fVar13 = pfVar7[uVar4 - iVar11 & uVar5];
      fVar1 = pfVar7[(uVar4 - iVar11) - 1 & uVar5];
      uVar6 = this->dboffs[1];
      this->mcnt = this->mfreq + uVar2;
      this->dbptr = uVar4 + 1 & uVar5;
      fVar13 = (fVar1 - fVar13) * ((float)((uint)(uVar10 >> 9) & 0x7fffff | 0x3f800000) + -1.0) +
               fVar13;
      pfVar7[uVar4] = this->fbval * fVar13 + fVar12;
      fVar1 = this->wetout;
      iVar11 = uVar2 + this->mphase;
      uVar10 = (ulong)(uint)(iVar11 >> 0x1f ^ iVar11 * 2) * (ulong)uVar3;
      iVar11 = (int)(uVar10 >> 0x20) + uVar6;
      fVar15 = (pfVar8[(uVar4 - iVar11) - 1 & uVar5] - pfVar8[uVar4 - iVar11 & uVar5]) *
               ((float)((uint)(uVar10 >> 9) & 0x7fffff | 0x3f800000) + -1.0) +
               pfVar8[uVar4 - iVar11 & uVar5];
      pfVar8[uVar4] = fVar15 * this->fbval + fVar12;
      SVar14._0_4_ = dest[uVar9].field_0.l + fVar12 * 0.0 + fVar1 * fVar13;
      SVar14._4_4_ = dest[uVar9].field_0.r + fVar12 * 0.0 + this->wetout * fVar15;
      dest[uVar9] = SVar14;
      uVar9 = uVar9 + 1;
    } while ((uint)nsamples != uVar9);
  }
  return;
}

Assistant:

void renderAux2Main(StereoSample *dest, int nsamples)
    {
        if (!wetout)
            return;

        COVER("MODDEL aux->main");

        for (int i=0; i < nsamples; i++)
        {
            StereoSample x;

            float in = inst->aux2buf[i] + fcdcoffset;
            processSample(&x, in, in, 0.0f);

            dest[i].l += x.l;
            dest[i].r += x.r;
        }
    }